

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LodRenderer.cpp
# Opt level: O1

void __thiscall
LodRenderer::removeDecoration(LodRenderer *this,repr coords,uint tileIndex,Drawable *drawable)

{
  pointer ppVar1;
  iterator __position;
  iterator iVar2;
  Drawable **ppDVar3;
  long lVar4;
  uint local_2c;
  repr local_28;
  
  local_2c = tileIndex;
  local_28 = coords;
  __position = FlatMap<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>,_std::less<unsigned_long>_>
               ::find(&this->decorations_,&local_28);
  iVar2 = FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>::find
                    (&(__position._M_current)->second,&local_2c);
  if ((iVar2._M_current)->second == drawable) {
    ppVar1 = ((__position._M_current)->second).vec_.
             super__Vector_base<std::pair<unsigned_int,_const_sf::Drawable_*>,_std::allocator<std::pair<unsigned_int,_const_sf::Drawable_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((iVar2._M_current + 1 != ppVar1) &&
       (lVar4 = (long)ppVar1 - (long)(iVar2._M_current + 1) >> 4, 0 < lVar4)) {
      lVar4 = lVar4 + 1;
      ppDVar3 = &iVar2._M_current[1].second;
      do {
        *(uint *)(ppDVar3 + -3) =
             ((pair<unsigned_int,_const_sf::Drawable_*> *)(ppDVar3 + -1))->first;
        ppDVar3[-2] = *ppDVar3;
        lVar4 = lVar4 + -1;
        ppDVar3 = ppDVar3 + 2;
      } while (1 < lVar4);
    }
    ((__position._M_current)->second).vec_.
    super__Vector_base<std::pair<unsigned_int,_const_sf::Drawable_*>,_std::allocator<std::pair<unsigned_int,_const_sf::Drawable_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1 + -1;
    if (((__position._M_current)->second).vec_.
        super__Vector_base<std::pair<unsigned_int,_const_sf::Drawable_*>,_std::allocator<std::pair<unsigned_int,_const_sf::Drawable_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start == ppVar1 + -1) {
      std::
      vector<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>
      ::_M_erase(&(this->decorations_).vec_,(iterator)__position._M_current);
    }
  }
  return;
}

Assistant:

void LodRenderer::removeDecoration(ChunkCoords::repr coords, unsigned int tileIndex, const sf::Drawable* drawable) {
    auto chunkDeco = decorations_.find(coords);
    auto deco = chunkDeco->second.find(tileIndex);
    if (deco->second != drawable) {
        // Do nothing if there is a different drawable at the selected coordinates.
        return;
    }
    chunkDeco->second.erase(deco);
    if (chunkDeco->second.empty()) {
        decorations_.erase(chunkDeco);
    }
}